

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegionSection *
memory_region_find_rcu
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion_conflict *mr,hwaddr addr,
          uint64_t size)

{
  undefined1 start [16];
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  AddrRange addr_00;
  AddrRange r1;
  AddrRange r1_00;
  undefined1 size_00 [16];
  undefined1 b [16];
  AddrRange r2;
  AddrRange r2_00;
  AddressSpace *as_00;
  uint64_t uVar1;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffe98;
  _Bool local_159;
  Int128 *local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  FlatView *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  FlatRange *local_68;
  FlatRange *fr;
  FlatView *view;
  AddrRange range;
  AddressSpace *as;
  MemoryRegion_conflict *root;
  uint64_t size_local;
  hwaddr addr_local;
  MemoryRegion_conflict *mr_local;
  
  uVar1 = 0;
  memset(__return_storage_ptr__,0,0x40);
  size_local = mr->addr + addr;
  as = (AddressSpace *)mr;
  while ((as->address_spaces_link).tqe_next != (AddressSpace *)0x0) {
    as = (as->address_spaces_link).tqe_next;
    size_local = (long)&(as[1].current_map)->ref + size_local;
  }
  as_00 = memory_region_to_address_space((MemoryRegion_conflict *)as);
  if (as_00 != (AddressSpace *)0x0) {
    int128_make64((Int128 *)size_local,uVar1);
    int128_make64((Int128 *)size,uVar1);
    start._8_8_ = in_stack_fffffffffffffe60;
    start._0_8_ = in_stack_fffffffffffffe58;
    size_00._8_8_ = in_stack_fffffffffffffe70;
    size_00._0_8_ = in_stack_fffffffffffffe68;
    addrrange_make((AddrRange *)&local_88,(Int128)start,(Int128)size_00);
    view = local_88;
    range.start._0_8_ = local_80;
    range.start._8_8_ = local_78;
    range.size._0_8_ = local_70;
    fr = (FlatRange *)address_space_to_flatview(as_00);
    addr_00.start._8_8_ = (undefined8)range.start;
    addr_00.start._0_8_ = view;
    addr_00.size._0_8_ = range.start._8_8_;
    addr_00.size._8_8_ = (undefined8)range.size;
    local_68 = flatview_lookup((FlatView *)fr,addr_00);
    if (local_68 != (FlatRange *)0x0) {
      while( true ) {
        local_159 = false;
        if ((FlatRange *)fr->offset_in_region < local_68) {
          r1.size._8_8_ = view;
          r1._0_24_ = *(undefined1 (*) [24])((long)&local_68[-1].addr.start + 8);
          r2.start._8_8_ = range.start._8_8_;
          r2.start._0_8_ = (undefined8)range.start;
          r2.size._0_8_ = (undefined8)range.size;
          r2.size._8_8_ = in_stack_fffffffffffffe98;
          local_159 = addrrange_intersects(r1,r2);
        }
        if (local_159 == false) break;
        local_68 = local_68 + -1;
      }
      __return_storage_ptr__->mr = local_68->mr;
      __return_storage_ptr__->fv = (FlatView *)fr;
      r1_00.start._8_8_ = range.start._8_8_;
      r1_00.start._0_8_ = (undefined8)range.start;
      r1_00.size._0_8_ = (undefined8)range.size;
      r1_00.size._8_8_ = (long)(local_68->addr).start;
      r2_00.size._8_8_ = in_stack_fffffffffffffe98;
      r2_00._0_24_ = *(undefined1 (*) [24])((long)&(local_68->addr).start + 8);
      uVar2 = range.start._8_8_;
      uVar3 = (undefined8)range.size;
      addrrange_intersection(r1_00,r2_00);
      range.start._8_8_ = local_d8;
      range.size._0_8_ = uStack_d0;
      __return_storage_ptr__->offset_within_region = local_68->offset_in_region;
      a._8_8_ = (undefined8)range.start;
      a._0_8_ = view;
      b._8_8_ = uVar3;
      b._0_8_ = uVar2;
      int128_sub(local_e8,(Int128)a,(Int128)b);
      a_00._8_8_ = (undefined8)range.start;
      a_00._0_8_ = view;
      uVar1 = int128_get64((Int128)a_00);
      __return_storage_ptr__->offset_within_region =
           __return_storage_ptr__->offset_within_region + uVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = (undefined8)range.size;
      *(undefined8 *)&__return_storage_ptr__->size = range.start._8_8_;
      a_01._8_8_ = (undefined8)range.start;
      a_01._0_8_ = view;
      uVar1 = int128_get64((Int128)a_01);
      __return_storage_ptr__->offset_within_address_space = uVar1;
      __return_storage_ptr__->readonly = (_Bool)(local_68->readonly & 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static MemoryRegionSection memory_region_find_rcu(MemoryRegion *mr,
                                                  hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret = { .mr = NULL };
    MemoryRegion *root;
    AddressSpace *as;
    AddrRange range;
    FlatView *view;
    FlatRange *fr;

    addr += mr->addr;
    for (root = mr; root->container; ) {
        root = root->container;
        addr += root->addr;
    }

    as = memory_region_to_address_space(root);
    if (!as) {
        return ret;
    }
    range = addrrange_make(int128_make64(addr), int128_make64(size));

    view = address_space_to_flatview(as);
    fr = flatview_lookup(view, range);
    if (!fr) {
        return ret;
    }

    while (fr > view->ranges && addrrange_intersects(fr[-1].addr, range)) {
        --fr;
    }

    ret.mr = fr->mr;
    ret.fv = view;
    range = addrrange_intersection(range, fr->addr);
    ret.offset_within_region = fr->offset_in_region;
    ret.offset_within_region += int128_get64(int128_sub(range.start,
                                                        fr->addr.start));
    ret.size = range.size;
    ret.offset_within_address_space = int128_get64(range.start);
    ret.readonly = fr->readonly;
    return ret;
}